

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

optional_idx duckdb::FileSystem::GetAvailableDiskSpace(string *path)

{
  bool bVar1;
  int iVar2;
  idx_t available_disk_space;
  statvfs vfs;
  optional_idx local_80;
  uint64_t local_78;
  statvfs local_70;
  
  iVar2 = statvfs((path->_M_dataplus)._M_p,&local_70);
  if (iVar2 != -1) {
    local_78 = 0xffffffffffffffff;
    bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                      (local_70.f_frsize,local_70.f_bfree,&local_78);
    if (bVar1) {
      optional_idx::optional_idx(&local_80,local_78);
      return (optional_idx)local_80.index;
    }
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx FileSystem::GetAvailableDiskSpace(const string &path) {
	struct statvfs vfs;

	auto ret = statvfs(path.c_str(), &vfs);
	if (ret == -1) {
		return optional_idx();
	}
	auto block_size = vfs.f_frsize;
	// These are the blocks available for creating new files or extending existing ones
	auto available_blocks = vfs.f_bfree;
	idx_t available_disk_space = DConstants::INVALID_INDEX;
	if (!TryMultiplyOperator::Operation(static_cast<idx_t>(block_size), static_cast<idx_t>(available_blocks),
	                                    available_disk_space)) {
		return optional_idx();
	}
	return available_disk_space;
}